

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O0

void __thiscall
capnproto_test::capnp::test::TestUnion::Union1::Builder::setU1f0sp(Builder *this,Reader value)

{
  PointerBuilder builder;
  Reader value_00;
  uint uVar1;
  PointerBuilder local_38;
  Builder *local_20;
  Builder *this_local;
  Reader value_local;
  
  value_local.super_StringPtr.content.ptr = value.super_StringPtr.content.size_;
  this_local = value.super_StringPtr.content.ptr;
  local_20 = this;
  uVar1 = ::capnp::bounded<1u>();
  ::capnp::_::StructBuilder::setDataField<capnproto_test::capnp::test::TestUnion::Union1::Which>
            (&this->_builder,uVar1,U1F0SP);
  uVar1 = ::capnp::bounded<1u>();
  ::capnp::_::StructBuilder::getPointerField(&local_38,&this->_builder,uVar1);
  value_00.super_StringPtr.content.size_ = (size_t)value_local.super_StringPtr.content.ptr;
  value_00.super_StringPtr.content.ptr = (char *)this_local;
  builder.capTable = local_38.capTable;
  builder.segment = local_38.segment;
  builder.pointer = local_38.pointer;
  ::capnp::_::PointerHelpers<capnp::Text,_(capnp::Kind)1>::set(builder,value_00);
  return;
}

Assistant:

inline void TestUnion::Union1::Builder::setU1f0sp( ::capnp::Text::Reader value) {
  _builder.setDataField<TestUnion::Union1::Which>(
      ::capnp::bounded<1>() * ::capnp::ELEMENTS, TestUnion::Union1::U1F0SP);
  ::capnp::_::PointerHelpers< ::capnp::Text>::set(_builder.getPointerField(
      ::capnp::bounded<1>() * ::capnp::POINTERS), value);
}